

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application_info_filter_test.cpp
# Opt level: O2

int main(void)

{
  unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
  this;
  bool bVar1;
  FILE *__stream;
  ApplicationInfoFilter *__p;
  Hash HVar2;
  Hash HVar3;
  Hash HVar4;
  Hash HVar5;
  uint32_t uVar6;
  int iVar7;
  VkApplicationInfo local_6c8;
  char *local_698;
  char *pcStack_690;
  Hash local_680;
  VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features;
  VkPhysicalDeviceDynamicRenderingFeatures dynamic_rendering_features;
  unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
  filter_handle;
  VkPhysicalDeviceBufferDeviceAddressFeatures bda_features;
  VkPhysicalDeviceVulkan13Features vulkan13_features;
  VkPhysicalDeviceDescriptorIndexingFeatures indexing_features;
  VkPhysicalDeviceFeatures2 features2;
  VkPhysicalDeviceVulkan12Features vulkan12_features;
  VkPhysicalDeviceProperties2 props2;
  
  __stream = fopen(".__test_appinfo.json","w");
  if (__stream == (FILE *)0x0) {
    uVar6 = 1;
  }
  else {
    fprintf(__stream,"%s\n",
            "\n{\n\t\"asset\": \"FossilizeApplicationInfoFilter\",\n\t\"version\" : 2,\n\t\"blacklistedApplicationNames\" : [ \"A\",  \"B\", \"C\" ],\n\t\"blacklistedEngineNames\" : [ \"D\", \"E\", \"F\" ],\n\t\"applicationFilters\" : {\n\t\t\"test1\" : { \"minimumApplicationVersion\" : 10 },\n\t\t\"test2\" : { \"minimumApplicationVersion\" : 10, \"minimumEngineVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : true },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : false }\n\t},\n\t\"engineFilters\" : {\n\t\t\"test1\" : {\n\t\t\t\"minimumEngineVersion\" : 10,\n\t\t\t\"bucketVariantDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"VendorID\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"ApplicationName\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\"\n\t\t\t]\n\t\t},\n\t\t\"variance\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ]\n\t\t},\n\t\t\"variance2\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ],\n\t\t\t\"bucketVariantFeatureDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\",\n\t\t\t\t\"DescriptorBuffer\"\n\t\t\t]\n\t\t},\n\t\t\"test2\" : { \"minimumEngineVersion\" : 10, \"minimumApplicationVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : false },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : true }\n\t},\n\t\"defaultBucketVariantDependencies\" : [\n\t\t\"ApplicationName\",\n\t\t\"EngineName\"\n\t],\n\t\"defaultBucketVariantFeatureDependencies\" : [\n\t\t\"DescriptorBuffer\"\n\t]\n}\n"
           );
    fclose(__stream);
    local_698 = (char *)0x0;
    pcStack_690 = (char *)0x0;
    filter_handle._M_t.
    super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    ._M_t.
    super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>._M_head_impl =
         (__uniq_ptr_data<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>,_true,_true>
          )(__uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
            )0x0;
    __p = Fossilize::ApplicationInfoFilter::parse
                    (".__test_appinfo.json",main::anon_class_1_0_00000001::__invoke,&local_698);
    std::
    __uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    ::reset((__uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
             *)&filter_handle,__p);
    this = filter_handle;
    if ((__uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
         )filter_handle._M_t.
          super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
          .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
         )0x0) {
      fwrite("Fossilize ERROR: Parsing did not complete successfully.\n",0x38,1,_stderr);
LAB_00102779:
      uVar6 = 1;
    }
    else {
      local_6c8.pEngineName = (char *)0x0;
      local_6c8.engineVersion = 0;
      local_6c8.apiVersion = 0;
      local_6c8.pApplicationName = (char *)0x0;
      local_6c8._24_8_ = 0;
      local_6c8.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_6c8._4_4_ = 0;
      local_6c8.pNext = (void *)0x0;
      bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                        ((ApplicationInfoFilter *)
                         filter_handle._M_t.
                         super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                         .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>.
                         _M_head_impl,(VkApplicationInfo *)0x0);
      uVar6 = 1;
      if (bVar1) {
        local_6c8.pApplicationName = "A";
        local_6c8.pEngineName = "G";
        bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                          ((ApplicationInfoFilter *)
                           this._M_t.
                           super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                           .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>.
                           _M_head_impl,&local_6c8);
        if (!bVar1) {
          local_6c8.pApplicationName = "D";
          local_6c8.pEngineName = "A";
          bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                            ((ApplicationInfoFilter *)
                             this._M_t.
                             super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                             .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>.
                             _M_head_impl,&local_6c8);
          if (bVar1) {
            local_6c8.pApplicationName = "H";
            local_6c8.pEngineName = "E";
            bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                              ((ApplicationInfoFilter *)
                               this._M_t.
                               super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                               .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>.
                               _M_head_impl,&local_6c8);
            if (!bVar1) {
              local_6c8.pApplicationName = "test1";
              local_6c8.pEngineName = (char *)0x0;
              local_6c8.applicationVersion = 9;
              bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                ((ApplicationInfoFilter *)
                                 this._M_t.
                                 super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                 .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>.
                                 _M_head_impl,&local_6c8);
              if (!bVar1) {
                local_6c8.applicationVersion = 10;
                bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                  ((ApplicationInfoFilter *)
                                   this._M_t.
                                   super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                   .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                   ._M_head_impl,&local_6c8);
                if (bVar1) {
                  local_6c8.pApplicationName = "test2";
                  bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                    ((ApplicationInfoFilter *)
                                     this._M_t.
                                     super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                     .
                                     super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                     ._M_head_impl,&local_6c8);
                  if (bVar1) {
                    local_6c8.pApplicationName = "test3";
                    local_6c8._24_8_ = local_6c8._24_8_ & 0xffffffff00000000;
                    local_6c8.apiVersion = 0x31;
                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                      ((ApplicationInfoFilter *)
                                       this._M_t.
                                       super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                       .
                                       super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                       ._M_head_impl,&local_6c8);
                    if (!bVar1) {
                      local_6c8.apiVersion = 0x32;
                      bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                        ((ApplicationInfoFilter *)
                                         this._M_t.
                                         super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                         .
                                         super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                         ._M_head_impl,&local_6c8);
                      if (bVar1) {
                        local_6c8.pApplicationName = (char *)0x0;
                        local_6c8.pEngineName = "test1";
                        local_6c8.engineVersion = 9;
                        bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                          ((ApplicationInfoFilter *)
                                           this._M_t.
                                           super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                           .
                                           super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                           ._M_head_impl,&local_6c8);
                        if (!bVar1) {
                          local_6c8.engineVersion = 10;
                          bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                            ((ApplicationInfoFilter *)
                                             this._M_t.
                                             super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                             .
                                             super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                             ._M_head_impl,&local_6c8);
                          if (bVar1) {
                            local_6c8.pEngineName = "test2";
                            bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                              ((ApplicationInfoFilter *)
                                               this._M_t.
                                               super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                               .
                                               super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                               ._M_head_impl,&local_6c8);
                            if (bVar1) {
                              local_6c8.pEngineName = "test3";
                              local_6c8.engineVersion = 0;
                              local_6c8.apiVersion = 0x31;
                              bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                ((ApplicationInfoFilter *)
                                                 this._M_t.
                                                 super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                 .
                                                 super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                 ._M_head_impl,&local_6c8);
                              if (!bVar1) {
                                local_6c8.apiVersion = 0x32;
                                bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                  ((ApplicationInfoFilter *)
                                                   this._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                if (bVar1) {
                                  local_6c8._40_8_ = local_6c8._40_8_ & 0xffffffff00000000;
                                  local_6c8._24_8_ = local_6c8._24_8_ & 0xffffffff00000000;
                                  iVar7 = 2;
                                  do {
                                    if (iVar7 == 0) {
                                      local_6c8.pEngineName = (char *)0x0;
                                      local_6c8.pApplicationName = "test1";
                                      bVar1 = Fossilize::ApplicationInfoFilter::needs_buckets
                                                        ((ApplicationInfoFilter *)
                                                         this._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                      if (bVar1) {
                                        local_6c8.pEngineName = "test1";
                                        local_6c8.pApplicationName = (char *)0x0;
                                        bVar1 = Fossilize::ApplicationInfoFilter::needs_buckets
                                                          ((ApplicationInfoFilter *)
                                                           this._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                        if (bVar1) {
                                          Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                    ((ApplicationInfoFilter *)
                                                     this._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,(VkPhysicalDeviceProperties2 *)0x0,
                                                  (VkApplicationInfo *)0x0,(void *)0x0);
                                          HVar2 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                            ((ApplicationInfoFilter *)
                                                             this._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,(VkPhysicalDeviceProperties2 *)0x0,
                                                  &local_6c8,(void *)0x0);
                                          memset(&props2,0,0x348);
                                          props2.sType = 
                                          VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                                          props2.properties.vendorID = 1;
                                          HVar3 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                            ((ApplicationInfoFilter *)
                                                             this._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,(void *)0x0);
                                          if (HVar2 != HVar3) {
                                            bda_features.bufferDeviceAddress = 0;
                                            bda_features.bufferDeviceAddressCaptureReplay = 0;
                                            bda_features.bufferDeviceAddressMultiDevice = 0;
                                            bda_features._28_4_ = 0;
                                            bda_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES
                                            ;
                                            bda_features._4_4_ = 0;
                                            bda_features.pNext = (void *)0x0;
                                            memset(&vulkan12_features,0,0xd0);
                                            vulkan12_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES
                                            ;
                                            vulkan13_features.pNext = (void *)0x0;
                                            vulkan13_features.dynamicRendering = 0;
                                            vulkan13_features.shaderIntegerDotProduct = 0;
                                            vulkan13_features.maintenance4 = 0;
                                            vulkan13_features._76_4_ = 0;
                                            vulkan13_features.computeFullSubgroups = 0;
                                            vulkan13_features.synchronization2 = 0;
                                            vulkan13_features.textureCompressionASTC_HDR = 0;
                                            vulkan13_features.shaderZeroInitializeWorkgroupMemory =
                                                 0;
                                            vulkan13_features.privateData = 0;
                                            vulkan13_features.shaderDemoteToHelperInvocation = 0;
                                            vulkan13_features.shaderTerminateInvocation = 0;
                                            vulkan13_features.subgroupSizeControl = 0;
                                            vulkan13_features.robustImageAccess = 0;
                                            vulkan13_features.inlineUniformBlock = 0;
                                            vulkan13_features.
                                            descriptorBindingInlineUniformBlockUpdateAfterBind = 0;
                                            vulkan13_features.pipelineCreationCacheControl = 0;
                                            vulkan13_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES
                                            ;
                                            vulkan13_features._4_4_ = 0;
                                            bda_features.pNext = &indexing_features;
                                            indexing_features.
                                            descriptorBindingUpdateUnusedWhilePending = 0;
                                            indexing_features.descriptorBindingPartiallyBound = 0;
                                            indexing_features.
                                            descriptorBindingVariableDescriptorCount = 0;
                                            indexing_features.runtimeDescriptorArray = 0;
                                            indexing_features.
                                            descriptorBindingStorageImageUpdateAfterBind = 0;
                                            indexing_features.
                                            descriptorBindingStorageBufferUpdateAfterBind = 0;
                                            indexing_features.
                                            descriptorBindingUniformTexelBufferUpdateAfterBind = 0;
                                            indexing_features.
                                            descriptorBindingStorageTexelBufferUpdateAfterBind = 0;
                                            indexing_features.
                                            shaderUniformTexelBufferArrayNonUniformIndexing = 0;
                                            indexing_features.
                                            shaderStorageTexelBufferArrayNonUniformIndexing = 0;
                                            indexing_features.
                                            descriptorBindingUniformBufferUpdateAfterBind = 0;
                                            indexing_features.
                                            descriptorBindingSampledImageUpdateAfterBind = 0;
                                            indexing_features.
                                            shaderSampledImageArrayNonUniformIndexing = 0;
                                            indexing_features.
                                            shaderStorageBufferArrayNonUniformIndexing = 0;
                                            indexing_features.
                                            shaderStorageImageArrayNonUniformIndexing = 0;
                                            indexing_features.
                                            shaderInputAttachmentArrayNonUniformIndexing = 0;
                                            indexing_features.
                                            shaderInputAttachmentArrayDynamicIndexing = 0;
                                            indexing_features.
                                            shaderUniformTexelBufferArrayDynamicIndexing = 0;
                                            indexing_features.
                                            shaderStorageTexelBufferArrayDynamicIndexing = 0;
                                            indexing_features.
                                            shaderUniformBufferArrayNonUniformIndexing = 0;
                                            indexing_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES
                                            ;
                                            indexing_features._4_4_ = 0;
                                            indexing_features.pNext = &mutable_features;
                                            mutable_features.mutableDescriptorType = 0;
                                            mutable_features._20_4_ = 0;
                                            mutable_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT
                                            ;
                                            mutable_features._4_4_ = 0;
                                            mutable_features.pNext = (void *)0x0;
                                            vrs_features.pipelineFragmentShadingRate = 0;
                                            vrs_features.primitiveFragmentShadingRate = 0;
                                            vrs_features.attachmentFragmentShadingRate = 0;
                                            vrs_features._28_4_ = 0;
                                            vrs_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR
                                            ;
                                            vrs_features._4_4_ = 0;
                                            vrs_features.pNext = (void *)0x0;
                                            dynamic_rendering_features.dynamicRendering = 0;
                                            dynamic_rendering_features._20_4_ = 0;
                                            dynamic_rendering_features.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES
                                            ;
                                            dynamic_rendering_features._4_4_ = 0;
                                            dynamic_rendering_features.pNext = (void *)0x0;
                                            memset(&features2,0,0xf0);
                                            features2.sType =
                                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
                                            features2.pNext = &bda_features;
                                            HVar2 = Fossilize::ApplicationInfoFilter::
                                                    get_bucket_hash((ApplicationInfoFilter *)
                                                                    this._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                            if (HVar3 == HVar2) {
                                              bda_features.bufferDeviceAddress = 1;
                                              HVar2 = Fossilize::ApplicationInfoFilter::
                                                      get_bucket_hash((ApplicationInfoFilter *)
                                                                      this._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                              if (HVar3 != HVar2) {
                                                indexing_features.
                                                descriptorBindingUniformBufferUpdateAfterBind = 1;
                                                HVar3 = Fossilize::ApplicationInfoFilter::
                                                        get_bucket_hash((ApplicationInfoFilter *)
                                                                        this._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                if (HVar2 != HVar3) {
                                                  mutable_features.mutableDescriptorType = 1;
                                                  HVar2 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) {
                                                    features2.pNext = &mutable_features;
                                                    vulkan12_features.
                                                    descriptorBindingUniformBufferUpdateAfterBind =
                                                         1;
                                                    mutable_features.pNext = &vulkan12_features;
                                                    vulkan12_features.bufferDeviceAddress =
                                                         vulkan12_features.
                                                                                                                  
                                                  descriptorBindingUniformBufferUpdateAfterBind;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 == HVar3) {
                                                    features2.pNext = (void *)0x0;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  features2.pNext = &vrs_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 == HVar3) {
                                                    vrs_features.primitiveFragmentShadingRate = 1;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 != HVar3) {
                                                    vrs_features.pipelineFragmentShadingRate = 1;
                                                    vrs_features.primitiveFragmentShadingRate = 0;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) {
                                                    vrs_features._16_8_ =
                                                         vrs_features._16_8_ & 0xffffffff00000000;
                                                    vrs_features.attachmentFragmentShadingRate = 1;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 != HVar3) {
                                                    features2.pNext = (void *)0x0;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  features2.pNext = &dynamic_rendering_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 == HVar3) {
                                                    dynamic_rendering_features.dynamicRendering = 1;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 != HVar3) {
                                                    features2.pNext = &vulkan13_features;
                                                    vulkan13_features.dynamicRendering = 1;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 == HVar2) {
                                                    local_6c8.pApplicationName = "foo";
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 != HVar3) {
                                                    local_6c8.pApplicationName = "blah";
                                                    local_6c8.pEngineName = "blah2";
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )this._M_t.
                                                                                                                                                          
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,(void *)0x0);
                                                  if (HVar2 != HVar3) goto LAB_00102779;
                                                  memset(&props2,0,0x348);
                                                  props2.sType = 
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                                                  memset(&features2,0,0xf0);
                                                  features2.sType =
                                                       VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
                                                  bda_features.bufferDeviceAddress = 0;
                                                  bda_features.bufferDeviceAddressCaptureReplay = 0;
                                                  bda_features.bufferDeviceAddressMultiDevice = 0;
                                                  bda_features._28_4_ = 0;
                                                  bda_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES
                                                  ;
                                                  bda_features._4_4_ = 0;
                                                  bda_features.pNext = (void *)0x0;
                                                  memset(&vulkan12_features,0,0xd0);
                                                  vulkan12_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES
                                                  ;
                                                  vulkan13_features.pNext = (void *)0x0;
                                                  vulkan13_features.dynamicRendering = 0;
                                                  vulkan13_features.shaderIntegerDotProduct = 0;
                                                  vulkan13_features.maintenance4 = 0;
                                                  vulkan13_features._76_4_ = 0;
                                                  vulkan13_features.computeFullSubgroups = 0;
                                                  vulkan13_features.synchronization2 = 0;
                                                  vulkan13_features.textureCompressionASTC_HDR = 0;
                                                  vulkan13_features.
                                                  shaderZeroInitializeWorkgroupMemory = 0;
                                                  vulkan13_features.privateData = 0;
                                                  vulkan13_features.shaderDemoteToHelperInvocation =
                                                       0;
                                                  vulkan13_features.shaderTerminateInvocation = 0;
                                                  vulkan13_features.subgroupSizeControl = 0;
                                                  vulkan13_features.robustImageAccess = 0;
                                                  vulkan13_features.inlineUniformBlock = 0;
                                                  vulkan13_features.
                                                  descriptorBindingInlineUniformBlockUpdateAfterBind
                                                       = 0;
                                                  vulkan13_features.pipelineCreationCacheControl = 0
                                                  ;
                                                  vulkan13_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES
                                                  ;
                                                  vulkan13_features._4_4_ = 0;
                                                  indexing_features.pNext = (void *)0x0;
                                                  indexing_features.
                                                  descriptorBindingUpdateUnusedWhilePending = 0;
                                                  indexing_features.descriptorBindingPartiallyBound
                                                       = 0;
                                                  indexing_features.
                                                  descriptorBindingVariableDescriptorCount = 0;
                                                  indexing_features.runtimeDescriptorArray = 0;
                                                  indexing_features.
                                                  descriptorBindingStorageImageUpdateAfterBind = 0;
                                                  indexing_features.
                                                  descriptorBindingStorageBufferUpdateAfterBind = 0;
                                                  indexing_features.
                                                  descriptorBindingUniformTexelBufferUpdateAfterBind
                                                       = 0;
                                                  indexing_features.
                                                  descriptorBindingStorageTexelBufferUpdateAfterBind
                                                       = 0;
                                                  indexing_features.
                                                  shaderUniformTexelBufferArrayNonUniformIndexing =
                                                       0;
                                                  indexing_features.
                                                  shaderStorageTexelBufferArrayNonUniformIndexing =
                                                       0;
                                                  indexing_features.
                                                  descriptorBindingUniformBufferUpdateAfterBind = 0;
                                                  indexing_features.
                                                  descriptorBindingSampledImageUpdateAfterBind = 0;
                                                  indexing_features.
                                                  shaderSampledImageArrayNonUniformIndexing = 0;
                                                  indexing_features.
                                                  shaderStorageBufferArrayNonUniformIndexing = 0;
                                                  indexing_features.
                                                  shaderStorageImageArrayNonUniformIndexing = 0;
                                                  indexing_features.
                                                  shaderInputAttachmentArrayNonUniformIndexing = 0;
                                                  indexing_features.
                                                  shaderInputAttachmentArrayDynamicIndexing = 0;
                                                  indexing_features.
                                                  shaderUniformTexelBufferArrayDynamicIndexing = 0;
                                                  indexing_features.
                                                  shaderStorageTexelBufferArrayDynamicIndexing = 0;
                                                  indexing_features.
                                                  shaderUniformBufferArrayNonUniformIndexing = 0;
                                                  indexing_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES
                                                  ;
                                                  indexing_features._4_4_ = 0;
                                                  dynamic_rendering_features.dynamicRendering = 0;
                                                  dynamic_rendering_features._20_4_ = 0;
                                                  dynamic_rendering_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT
                                                  ;
                                                  dynamic_rendering_features._4_4_ = 0;
                                                  dynamic_rendering_features.pNext = (void *)0x0;
                                                  vrs_features.pipelineFragmentShadingRate = 0;
                                                  vrs_features.primitiveFragmentShadingRate = 0;
                                                  vrs_features.attachmentFragmentShadingRate = 0;
                                                  vrs_features._28_4_ = 0;
                                                  vrs_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR
                                                  ;
                                                  vrs_features._4_4_ = 0;
                                                  vrs_features.pNext = (void *)0x0;
                                                  mutable_features.mutableDescriptorType = 0;
                                                  mutable_features._20_4_ = 0;
                                                  mutable_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT
                                                  ;
                                                  mutable_features._4_4_ = 0;
                                                  mutable_features.pNext = (void *)0x0;
                                                  props2.properties.vendorID = 1;
                                                  local_6c8.pEngineName = "variance";
                                                  local_6c8.pApplicationName = (char *)0x0;
                                                  HVar2 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  local_6c8.pEngineName = "variance2";
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 != HVar3) goto LAB_00102779;
                                                  features2.pNext = &mutable_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &bda_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &vulkan12_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &vulkan13_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &indexing_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &dynamic_rendering_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &vrs_features;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 != HVar2) goto LAB_00102779;
                                                  features2.pNext = &mutable_features;
                                                  uVar6 = 1;
                                                  mutable_features.mutableDescriptorType = 1;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if ((HVar2 == HVar3) || (HVar3 == HVar4))
                                                  goto LAB_00102779;
                                                  features2.pNext = &bda_features;
                                                  bda_features.bufferDeviceAddress = 1;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar2 == HVar3) goto LAB_00102779;
                                                  features2.pNext = &vulkan12_features;
                                                  vulkan12_features.bufferDeviceAddress = 1;
                                                  HVar2 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if (HVar3 == HVar2) {
                                                    memset(&props2,0,0x348);
                                                    props2.sType = 
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                                                  memset(&features2,0,0xf0);
                                                  features2.sType =
                                                       VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
                                                  vulkan12_features.samplerMirrorClampToEdge = 0;
                                                  vulkan12_features.drawIndirectCount = 0;
                                                  vulkan12_features.storageBuffer8BitAccess = 0;
                                                  vulkan12_features.
                                                  uniformAndStorageBuffer8BitAccess = 0;
                                                  vulkan12_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES
                                                  ;
                                                  vulkan12_features._4_4_ = 0;
                                                  vulkan12_features.pNext = (void *)0x0;
                                                  indexing_features.
                                                  shaderInputAttachmentArrayDynamicIndexing = 0;
                                                  indexing_features.
                                                  shaderUniformTexelBufferArrayDynamicIndexing = 0;
                                                  indexing_features.
                                                  shaderStorageTexelBufferArrayDynamicIndexing = 0;
                                                  indexing_features.
                                                  shaderUniformBufferArrayNonUniformIndexing = 0;
                                                  indexing_features.sType =
                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT
                                                  ;
                                                  indexing_features._4_4_ = 0;
                                                  indexing_features.pNext = (void *)0x0;
                                                  uVar6 = 1;
                                                  local_6c8.pEngineName = (char *)0x0;
                                                  local_6c8.pApplicationName = (char *)0x0;
                                                  props2.properties.vendorID = uVar6;
                                                  HVar2 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  features2.pNext = &vulkan12_features;
                                                  vulkan12_features.samplerMirrorClampToEdge = 1;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  features2.pNext = &indexing_features;
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  indexing_features.
                                                  shaderInputAttachmentArrayDynamicIndexing = 1;
                                                  local_680 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash((ApplicationInfoFilter
                                                                               *)this._M_t.
                                                                                                                                                                  
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  indexing_features.
                                                  shaderUniformBufferArrayNonUniformIndexing = 1;
                                                  HVar5 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          this._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&props2,&local_6c8,&features2);
                                                  if ((((HVar2 == HVar3) && (HVar3 == HVar4)) &&
                                                      (HVar2 != local_680)) && (local_680 != HVar5))
                                                  {
                                                    local_6c8.pApplicationName = "test5";
                                                    local_6c8.pEngineName = (char *)0x0;
                                                    bVar1 = Fossilize::ApplicationInfoFilter::
                                                            should_record_immutable_samplers
                                                                      ((ApplicationInfoFilter *)
                                                                       this._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                                  if (bVar1) {
                                                    local_6c8.pApplicationName = "test6";
                                                    bVar1 = Fossilize::ApplicationInfoFilter::
                                                            should_record_immutable_samplers
                                                                      ((ApplicationInfoFilter *)
                                                                       this._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                                  if (!bVar1) {
                                                    local_6c8.pApplicationName = (char *)0x0;
                                                    local_6c8.pEngineName = "test5";
                                                    bVar1 = Fossilize::ApplicationInfoFilter::
                                                            should_record_immutable_samplers
                                                                      ((ApplicationInfoFilter *)
                                                                       this._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                                  if (!bVar1) {
                                                    local_6c8.pEngineName = "test6";
                                                    bVar1 = Fossilize::ApplicationInfoFilter::
                                                            should_record_immutable_samplers
                                                                      ((ApplicationInfoFilter *)
                                                                       this._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                                  if (bVar1) {
                                                    remove(".__test_appinfo.json");
                                                    uVar6 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                      break;
                                    }
                                    local_698 = (char *)0x0;
                                    pcStack_690 = (char *)0x0;
                                    local_6c8.pApplicationName = (char *)0x0;
                                    local_6c8.pEngineName = "test4";
                                    if (iVar7 == 2) {
                                      local_6c8.pApplicationName = "test4";
                                      local_6c8.pEngineName = (char *)0x0;
                                    }
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (!bVar1) break;
                                    local_698 = "TEST_FOO";
                                    pcStack_690 = "foo";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (!bVar1) break;
                                    local_698 = "TEST_ENV";
                                    pcStack_690 = "foo";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (bVar1) break;
                                    pcStack_690 = "Afoo";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (bVar1) break;
                                    pcStack_690 = "fooA";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (bVar1) break;
                                    pcStack_690 = "bar";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (bVar1) break;
                                    pcStack_690 = "bar2";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (bVar1) break;
                                    pcStack_690 = "bar3";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (!bVar1) break;
                                    local_698 = "TEST";
                                    pcStack_690 = (char *)0x0;
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    if (!bVar1) break;
                                    pcStack_690 = "";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)
                                                       this._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                                  .
                                                  super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                                  ._M_head_impl,&local_6c8);
                                    iVar7 = iVar7 + -1;
                                  } while (!bVar1);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    ::~unique_ptr(&filter_handle);
  }
  return uVar6;
}

Assistant:

int main()
{
	const char *test_json =
R"delim(
{
	"asset": "FossilizeApplicationInfoFilter",
	"version" : 2,
	"blacklistedApplicationNames" : [ "A",  "B", "C" ],
	"blacklistedEngineNames" : [ "D", "E", "F" ],
	"applicationFilters" : {
		"test1" : { "minimumApplicationVersion" : 10 },
		"test2" : { "minimumApplicationVersion" : 10, "minimumEngineVersion" : 1000 },
		"test3" : { "minimumApiVersion" : 50 },
		"test4" : {
			"blacklistedEnvironments" : {
				"TEST_ENV" : { "contains" : "foo", "equals" : "bar" },
				"TEST_ENV" : { "equals" : "bar2", "contains": "" },
				"TEST" : { "nonnull" : true }
			}
		},
		"test5" : { "recordImmutableSamplers" : true },
		"test6" : { "recordImmutableSamplers" : false }
	},
	"engineFilters" : {
		"test1" : {
			"minimumEngineVersion" : 10,
			"bucketVariantDependencies" : [
				"BindlessUBO",
				"VendorID",
				"MutableDescriptorType",
				"BufferDeviceAddress",
				"DummyIgnored",
				"ApplicationName",
				"FragmentShadingRate",
				"DynamicRendering"
			]
		},
		"variance" : {
			"bucketVariantDependencies" : [ "VendorID" ]
		},
		"variance2" : {
			"bucketVariantDependencies" : [ "VendorID" ],
			"bucketVariantFeatureDependencies" : [
				"BindlessUBO",
				"MutableDescriptorType",
				"BufferDeviceAddress",
				"DummyIgnored",
				"FragmentShadingRate",
				"DynamicRendering",
				"DescriptorBuffer"
			]
		},
		"test2" : { "minimumEngineVersion" : 10, "minimumApplicationVersion" : 1000 },
		"test3" : { "minimumApiVersion" : 50 },
		"test4" : {
			"blacklistedEnvironments" : {
				"TEST_ENV" : { "contains" : "foo", "equals" : "bar" },
				"TEST_ENV" : { "equals" : "bar2", "contains": "" },
				"TEST" : { "nonnull" : true }
			}
		},
		"test5" : { "recordImmutableSamplers" : false },
		"test6" : { "recordImmutableSamplers" : true }
	},
	"defaultBucketVariantDependencies" : [
		"ApplicationName",
		"EngineName"
	],
	"defaultBucketVariantFeatureDependencies" : [
		"DescriptorBuffer"
	]
}
)delim";

	if (!write_string_to_file(".__test_appinfo.json", test_json))
		return EXIT_FAILURE;

	struct UserData
	{
		const char *env = nullptr;
		const char *data = nullptr;
	} data = {};

	const auto getenv_wrapper = +[](const char *env, void *userdata) -> const char *
	{
		auto *env_data = static_cast<const UserData *>(userdata);
		if (env_data->env && strcmp(env_data->env, env) == 0)
			return env_data->data;
		else
			return nullptr;
	};

	std::unique_ptr<Fossilize::ApplicationInfoFilter> filter_handle;
	filter_handle.reset(Fossilize::ApplicationInfoFilter::parse(".__test_appinfo.json",
																getenv_wrapper, &data));

	if (!filter_handle)
	{
		LOGE("Parsing did not complete successfully.\n");
		return EXIT_FAILURE;
	}

	auto &filter = *filter_handle;

	VkApplicationInfo appinfo = { VK_STRUCTURE_TYPE_APPLICATION_INFO };

	if (!filter.test_application_info(nullptr))
		return EXIT_FAILURE;

	// Test blacklists
	appinfo.pApplicationName = "A";
	appinfo.pEngineName = "G";
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "D";
	appinfo.pEngineName = "A";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "H";
	appinfo.pEngineName = "E";
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Test application version filtering
	appinfo.pApplicationName = "test1";
	appinfo.pEngineName = nullptr;
	appinfo.applicationVersion = 9;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;
	appinfo.applicationVersion = 10;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Engine version should be ignored for appinfo filters.
	appinfo.pApplicationName = "test2";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "test3";
	appinfo.applicationVersion = 0;
	appinfo.apiVersion = 49;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.apiVersion = 50;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Test engine version filtering
	appinfo.pApplicationName = nullptr;
	appinfo.pEngineName = "test1";
	appinfo.engineVersion = 9;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;
	appinfo.engineVersion = 10;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Engine version should be ignored for appinfo filters.
	appinfo.pEngineName = "test2";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pEngineName = "test3";
	appinfo.engineVersion = 0;
	appinfo.apiVersion = 49;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.apiVersion = 50;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.engineVersion = 0;
	appinfo.applicationVersion = 0;

	for (unsigned i = 0; i < 2; i++)
	{
		data = {};

		// Test env blacklisting (application)
		if (i == 0)
		{
			appinfo.pApplicationName = "test4";
			appinfo.pEngineName = nullptr;
		}
		else
		{
			appinfo.pEngineName = "test4";
			appinfo.pApplicationName = nullptr;
		}

		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.env = "TEST_FOO";
		data.data = "foo";

		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Contains test, should fail
		data.env = "TEST_ENV";

		data.data = "foo";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.data = "Afoo";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.data = "fooA";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Equals bar, should fail
		data.data = "bar";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Equals bar2, should fail
		data.data = "bar2";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should not fail
		data.data = "bar3";
		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should not fail
		data.env = "TEST";
		data.data = nullptr;
		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should fail
		data.data = "";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;
	}

	// Test bucket variant filter.
	appinfo.pEngineName = nullptr;
	appinfo.pApplicationName = "test1";
	if (!filter.needs_buckets(&appinfo))
		return EXIT_FAILURE;

	appinfo.pEngineName = "test1";
	appinfo.pApplicationName = nullptr;
	if (!filter.needs_buckets(&appinfo))
		return EXIT_FAILURE;

	{
		// Make sure this doesn't crash.
		filter.get_bucket_hash(nullptr, nullptr, nullptr);

		auto hash0 = filter.get_bucket_hash(nullptr, &appinfo, nullptr);
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		props2.properties.vendorID = 1;
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, nullptr);
		if (hash0 == hash1)
			return EXIT_FAILURE;

		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceVulkan12Features vulkan12_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES };
		VkPhysicalDeviceVulkan13Features vulkan13_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES };
		VkPhysicalDeviceDescriptorIndexingFeatures indexing_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES };
		VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT };
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
		VkPhysicalDeviceDynamicRenderingFeatures dynamic_rendering_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES };

		bda_features.pNext = &indexing_features;
		indexing_features.pNext = &mutable_features;
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		features2.pNext = &bda_features;

		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 != hash2)
			return EXIT_FAILURE;

		// Try to enable one feature at a time and verify it's the same.
		bda_features.bufferDeviceAddress = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash2 == hash3)
			return EXIT_FAILURE;

		indexing_features.descriptorBindingUniformBufferUpdateAfterBind = VK_TRUE;
		auto hash4 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash3 == hash4)
			return EXIT_FAILURE;

		mutable_features.mutableDescriptorType = VK_TRUE;
		auto hash5 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash4 == hash5)
			return EXIT_FAILURE;

		// Verify that the 1.2 structs can also be used.
		mutable_features.pNext = &vulkan12_features;
		features2.pNext = &mutable_features;
		vulkan12_features.descriptorBindingUniformBufferUpdateAfterBind = VK_TRUE;
		vulkan12_features.bufferDeviceAddress = VK_TRUE;
		auto hash6 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash5 != hash6)
			return EXIT_FAILURE;

		features2.pNext = nullptr;
		auto hash7 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &vrs_features;
		auto hash8 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash7 != hash8)
			return EXIT_FAILURE;
		vrs_features.primitiveFragmentShadingRate = VK_TRUE;
		auto hash9 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash8 == hash9)
			return EXIT_FAILURE;
		vrs_features.primitiveFragmentShadingRate = VK_FALSE;
		vrs_features.pipelineFragmentShadingRate = VK_TRUE;
		auto hash10 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash9 == hash10)
			return EXIT_FAILURE;
		vrs_features.pipelineFragmentShadingRate = VK_FALSE;
		vrs_features.attachmentFragmentShadingRate = VK_TRUE;
		auto hash11 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash10 == hash11)
			return EXIT_FAILURE;

		features2.pNext = nullptr;
		auto hash12 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &dynamic_rendering_features;
		auto hash13 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash12 != hash13)
			return EXIT_FAILURE;
		dynamic_rendering_features.dynamicRendering = VK_TRUE;
		auto hash14 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash13 == hash14)
			return EXIT_FAILURE;
		vulkan13_features.dynamicRendering = VK_TRUE;
		features2.pNext = &vulkan13_features;
		auto hash15 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash14 != hash15)
			return EXIT_FAILURE;

		// Spot check for ApplicationName.
		appinfo.pApplicationName = "foo";
		auto hash16 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash16 == hash15)
			return EXIT_FAILURE;

		// Check that the default variant hash is used.
		appinfo.pApplicationName = "blah";
		appinfo.pEngineName = "blah2";
		auto hash17 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		auto hash18 = filter.get_bucket_hash(&props2, &appinfo, nullptr);
		if (hash17 != hash18)
			return EXIT_FAILURE;
	}

	// Test that feature hashing works as intended.
	{
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceVulkan12Features vulkan12_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES };
		VkPhysicalDeviceVulkan13Features vulkan13_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES };
		VkPhysicalDeviceDescriptorIndexingFeatures indexing_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES };
		VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT };
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
		VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT };

		props2.properties.vendorID = 1;
		appinfo.pEngineName = "variance";
		appinfo.pApplicationName = nullptr;

		auto hash0 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		appinfo.pEngineName = "variance2";
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, &features2);

		if (hash0 != hash1)
			return EXIT_FAILURE;

		// Ensure that hashing disabled structs does not change anything either.
		features2.pNext = &descriptor_buffer_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &bda_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vulkan12_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vulkan13_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &indexing_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &mutable_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vrs_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &descriptor_buffer_features;
		descriptor_buffer_features.descriptorBuffer = VK_TRUE;
		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBufferPushDescriptors = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 == hash2 || hash2 == hash3)
			return EXIT_FAILURE;

		features2.pNext = &bda_features;
		bda_features.bufferDeviceAddress = VK_TRUE;
		hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 == hash2)
			return EXIT_FAILURE;
		features2.pNext = &vulkan12_features;
		vulkan12_features.bufferDeviceAddress = VK_TRUE;
		hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash2 != hash3)
			return EXIT_FAILURE;
	}

	// Test that we can pick up defaultFeatureVariantFilter.
	{
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT };

		props2.properties.vendorID = 1;
		appinfo.pEngineName = nullptr;
		appinfo.pApplicationName = nullptr;

		auto hash0 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &bda_features;
		bda_features.bufferDeviceAddress = VK_TRUE;
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &descriptor_buffer_features;
		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBuffer = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBufferPushDescriptors = VK_TRUE;
		auto hash4 = filter.get_bucket_hash(&props2, &appinfo, &features2);

		if (hash0 != hash1 || hash1 != hash2)
			return EXIT_FAILURE;
		if (hash2 == hash3 || hash3 == hash4)
			return EXIT_FAILURE;
	}

	{
		appinfo.pApplicationName = "test5";
		appinfo.pEngineName = nullptr;
		if (!filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pApplicationName = "test6";
		if (filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pApplicationName = nullptr;
		appinfo.pEngineName = "test5";
		if (filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pEngineName = "test6";
		if (!filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
	}

	remove(".__test_appinfo.json");
}